

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

ParseableFunctionInfo * __thiscall Js::FunctionProxy::EnsureDeserialized(FunctionProxy *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint uVar4;
  FunctionInfo *pFVar5;
  FunctionProxy *pFVar6;
  undefined4 *puVar7;
  FunctionBody *local_18;
  FunctionProxy *executionFunctionBody;
  FunctionProxy *this_local;
  
  pFVar5 = GetFunctionInfo(this);
  pFVar6 = FunctionInfo::GetFunctionProxy(pFVar5);
  if (this != pFVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x81a,"(this == this->GetFunctionInfo()->GetFunctionProxy())",
                                "this == this->GetFunctionInfo()->GetFunctionProxy()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  BVar3 = IsDeferredDeserializeFunction(this);
  local_18 = (FunctionBody *)this;
  if (BVar3 != 0) {
    uVar4 = (*(this->m_scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
    if ((uVar4 & 1) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x821,"(!m_scriptContext->IsClosed())",
                                  "!m_scriptContext->IsClosed()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    local_18 = DeferDeserializeFunctionInfo::Deserialize((DeferDeserializeFunctionInfo *)this);
    pFVar5 = GetFunctionInfo(this);
    FunctionInfo::SetFunctionProxy(pFVar5,(FunctionProxy *)local_18);
    pFVar5 = GetFunctionInfo((FunctionProxy *)local_18);
    BVar3 = FunctionInfo::HasBody(pFVar5);
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x825,"(executionFunctionBody->GetFunctionInfo()->HasBody())",
                                  "executionFunctionBody->GetFunctionInfo()->HasBody()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    if (local_18 == (FunctionBody *)this) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x826,"(executionFunctionBody != this)",
                                  "executionFunctionBody != this");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
  }
  return &local_18->super_ParseableFunctionInfo;
}

Assistant:

ParseableFunctionInfo * FunctionProxy::EnsureDeserialized()
    {
        Assert(this == this->GetFunctionInfo()->GetFunctionProxy());
        FunctionProxy * executionFunctionBody = this;

        if (IsDeferredDeserializeFunction())
        {
            // No need to deserialize function body if scriptContext closed because we can't execute it.
            // Bigger problem is the script engine might have released bytecode file mapping and we can't deserialize.
            Assert(!m_scriptContext->IsClosed());

            executionFunctionBody = ((DeferDeserializeFunctionInfo*) this)->Deserialize();
            this->GetFunctionInfo()->SetFunctionProxy(executionFunctionBody);
            Assert(executionFunctionBody->GetFunctionInfo()->HasBody());
            Assert(executionFunctionBody != this);
        }

        return (ParseableFunctionInfo *)executionFunctionBody;
    }